

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> __thiscall
pbrt::MIPMap::CreateFromFile
          (MIPMap *this,string *filename,MIPMapFilterOptions *options,WrapMode wrapMode,
          ColorEncodingHandle *encoding,Allocator alloc)

{
  float fVar1;
  bool bVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  float *pfVar4;
  long lVar5;
  int x;
  long lVar6;
  long lVar7;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  allocator<char> local_3f3;
  allocator<char> local_3f2;
  allocator<char> local_3f1;
  Allocator alloc_local;
  WrapMode wrapMode_local;
  _Head_base<0UL,_pbrt::MIPMap_*,_false> local_3d8;
  WrapMode2D local_3d0;
  ImageChannelDesc rgbDesc;
  ImageChannelDesc rgbaDesc;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_368;
  RGBColorSpace *colorSpace;
  float *local_358;
  float local_344;
  string local_340 [32];
  string local_320 [32];
  string local_300 [184];
  ImageAndMetadata imageAndMetadata;
  
  local_368.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  alloc_local = alloc;
  wrapMode_local = wrapMode;
  Image::Read(&imageAndMetadata,filename,alloc,(ColorEncodingHandle *)&local_368);
  if ((int)imageAndMetadata.image.channelNames.nStored != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorSpace,"R",(allocator<char> *)&rgbDesc);
    std::__cxx11::string::string<std::allocator<char>>(local_340,"G",&local_3f1);
    std::__cxx11::string::string<std::allocator<char>>(local_320,"B",&local_3f2);
    std::__cxx11::string::string<std::allocator<char>>(local_300,"A",&local_3f3);
    requestedChannels.n = 4;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorSpace;
    Image::GetChannelDesc(&rgbaDesc,&imageAndMetadata.image,requestedChannels);
    lVar5 = 0x60;
    do {
      std::__cxx11::string::~string((string *)((long)&colorSpace + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    std::__cxx11::string::string<std::allocator<char>>((string *)&colorSpace,"R",&local_3f1);
    std::__cxx11::string::string<std::allocator<char>>(local_340,"G",&local_3f2);
    std::__cxx11::string::string<std::allocator<char>>(local_320,"B",&local_3f3);
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorSpace;
    Image::GetChannelDesc(&rgbDesc,&imageAndMetadata.image,requestedChannels_00);
    lVar5 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&colorSpace + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    if (rgbaDesc.offset.nStored == 0) {
      if (rgbDesc.offset.nStored == 0) {
        ErrorExit<std::__cxx11::string_const&>
                  ("%s: image doesn\'t have R, G, and B channels",filename);
      }
      Image::SelectChannels((Image *)&colorSpace,&imageAndMetadata.image,&rgbDesc,alloc_local);
      Image::operator=(&imageAndMetadata.image,(Image *)&colorSpace);
    }
    else {
      bVar2 = true;
      lVar7 = 0;
      TVar3 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>;
      local_3d8._M_head_impl = this;
      for (lVar5 = 0; lVar5 < (long)TVar3 >> 0x20; lVar5 = lVar5 + 1) {
        for (lVar6 = 0; lVar6 < TVar3.x; lVar6 = lVar6 + 1) {
          WrapMode2D::WrapMode2D(&local_3d0,Clamp);
          Image::GetChannels((ImageChannelValues *)&colorSpace,&imageAndMetadata.image,
                             (Point2i)(lVar7 + lVar6),&rgbaDesc,local_3d0);
          pfVar4 = local_358 + 3;
          if (local_358 == (float *)0x0) {
            pfVar4 = &local_344;
          }
          fVar1 = *pfVar4;
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                     &colorSpace);
          bVar2 = (bool)(bVar2 & fVar1 == 1.0);
          TVar3 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>;
        }
        lVar7 = lVar7 + 0x100000000;
      }
      if (bVar2) {
        Image::SelectChannels((Image *)&colorSpace,&imageAndMetadata.image,&rgbDesc,alloc_local);
        this = local_3d8._M_head_impl;
        Image::operator=(&imageAndMetadata.image,(Image *)&colorSpace);
      }
      else {
        Image::SelectChannels((Image *)&colorSpace,&imageAndMetadata.image,&rgbaDesc,alloc_local);
        this = local_3d8._M_head_impl;
        Image::operator=(&imageAndMetadata.image,(Image *)&colorSpace);
      }
    }
    Image::~Image((Image *)&colorSpace);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&rgbDesc.offset);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&rgbaDesc.offset);
  }
  colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
  std::
  make_unique<pbrt::MIPMap,pbrt::Image,pbrt::RGBColorSpace_const*&,pbrt::WrapMode&,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::MIPMapFilterOptions_const&>
            ((Image *)this,(RGBColorSpace **)&imageAndMetadata,(WrapMode *)&colorSpace,
             (polymorphic_allocator<std::byte> *)&wrapMode_local,(MIPMapFilterOptions *)&alloc_local
            );
  ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
  return (__uniq_ptr_data<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>,_true,_true>)
         (tuple<pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>)this;
}

Assistant:

std::unique_ptr<MIPMap> MIPMap::CreateFromFile(const std::string &filename,
                                               const MIPMapFilterOptions &options,
                                               WrapMode wrapMode,
                                               ColorEncodingHandle encoding,
                                               Allocator alloc) {
    ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc, encoding);

    Image &image = imageAndMetadata.image;
    if (image.NChannels() != 1) {
        // Get the channels in a canonical order..
        ImageChannelDesc rgbaDesc = image.GetChannelDesc({"R", "G", "B", "A"});
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (rgbaDesc) {
            // Is alpha all ones?
            bool allOne = true;
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    if (image.GetChannels({x, y}, rgbaDesc)[3] != 1)
                        allOne = false;
            if (allOne)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                image = image.SelectChannels(rgbaDesc, alloc);
        } else {
            if (rgbDesc)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                ErrorExit("%s: image doesn't have R, G, and B channels", filename);
        }
    }

    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();
    return std::make_unique<MIPMap>(std::move(image), colorSpace, wrapMode, alloc,
                                    options);
}